

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_tonextreg(FuncState *fs,ExpDesc *e)

{
  ExpDesc *e_local;
  FuncState *fs_local;
  
  expr_discharge(fs,e);
  expr_free(fs,e);
  bcreg_reserve(fs,1);
  expr_toreg(fs,e,fs->freereg - 1);
  return;
}

Assistant:

static void expr_tonextreg(FuncState *fs, ExpDesc *e)
{
  expr_discharge(fs, e);
  expr_free(fs, e);
  bcreg_reserve(fs, 1);
  expr_toreg(fs, e, fs->freereg - 1);
}